

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O3

int IDARcheck3(IDAMem IDA_mem)

{
  uint uVar1;
  int *piVar2;
  sunrealtype *psVar3;
  int *piVar4;
  double dVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  ulong uVar16;
  sunrealtype *psVar17;
  int iVar18;
  sunrealtype sVar19;
  double dVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  
  if (IDA_mem->ida_taskc == 1) {
    uVar9 = -(ulong)((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh < 0.0);
    sVar19 = (sunrealtype)(~uVar9 & (ulong)IDA_mem->ida_tn | (ulong)IDA_mem->ida_toutc & uVar9);
    IDA_mem->ida_thi = sVar19;
  }
  else if (IDA_mem->ida_taskc == 2) {
    sVar19 = IDA_mem->ida_tn;
    IDA_mem->ida_thi = sVar19;
  }
  else {
    sVar19 = IDA_mem->ida_thi;
  }
  IDAGetSolution(IDA_mem,sVar19,IDA_mem->ida_yy,IDA_mem->ida_yp);
  iVar7 = (*IDA_mem->ida_gfun)
                    (IDA_mem->ida_thi,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_ghi,
                     IDA_mem->ida_user_data);
  IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
  if (iVar7 != 0) {
    return -10;
  }
  dVar20 = (ABS(IDA_mem->ida_hh) + ABS(IDA_mem->ida_tn)) * IDA_mem->ida_uround * 100.0;
  IDA_mem->ida_ttol = dVar20;
  uVar9 = (ulong)(uint)IDA_mem->ida_nrtfn;
  if (IDA_mem->ida_nrtfn < 1) {
    IDA_mem->ida_trout = IDA_mem->ida_thi;
    IDA_mem->ida_tlo = IDA_mem->ida_thi;
LAB_00115309:
    iVar7 = 0;
  }
  else {
    piVar2 = IDA_mem->ida_gactive;
    bVar15 = true;
    bVar6 = false;
    iVar7 = 0;
    uVar16 = 0;
    dVar25 = 0.0;
LAB_00114bb2:
    do {
      uVar12 = uVar16 + 1;
      if (piVar2[uVar16] != 0) {
        dVar23 = IDA_mem->ida_ghi[uVar16];
        if ((dVar23 != 0.0) || (NAN(dVar23))) {
          dVar5 = IDA_mem->ida_glo[uVar16];
          if ((((0.0 < dVar23) && (dVar5 < 0.0)) || ((dVar23 < 0.0 && (0.0 < dVar5)))) &&
             (((double)IDA_mem->ida_rootdir[uVar16] * dVar5 <= 0.0 &&
              (dVar23 = ABS(dVar23 / (dVar23 - dVar5)), dVar25 < dVar23)))) {
            iVar7 = (int)uVar16;
            bVar15 = false;
            uVar16 = uVar12;
            dVar25 = dVar23;
            if (uVar9 == uVar12) {
              iVar7 = (int)uVar12 + -1;
              goto LAB_00114d63;
            }
            goto LAB_00114bb2;
          }
        }
        else if ((double)IDA_mem->ida_rootdir[uVar16] * IDA_mem->ida_glo[uVar16] <= 0.0) {
          bVar6 = true;
        }
      }
      uVar16 = uVar12;
    } while (uVar12 != uVar9);
    if (bVar15) {
      IDA_mem->ida_trout = IDA_mem->ida_thi;
      psVar17 = IDA_mem->ida_ghi;
      psVar3 = IDA_mem->ida_grout;
      uVar16 = 0;
      do {
        psVar3[uVar16] = psVar17[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar9 != uVar16);
      if (bVar6) {
        piVar4 = IDA_mem->ida_iroots;
        lVar14 = 0;
        do {
          piVar4[lVar14] = 0;
          if (((piVar2[lVar14] != 0) && (psVar17[lVar14] == 0.0)) &&
             ((double)IDA_mem->ida_rootdir[lVar14] * IDA_mem->ida_glo[lVar14] <= 0.0)) {
            piVar4[lVar14] = (uint)(IDA_mem->ida_glo[lVar14] <= 0.0) * 2 + -1;
          }
          lVar14 = lVar14 + 1;
          uVar9 = (ulong)IDA_mem->ida_nrtfn;
        } while (lVar14 < (long)uVar9);
        goto LAB_00115276;
      }
      bVar6 = true;
LAB_00115278:
      if ((int)uVar9 < 1) {
        IDA_mem->ida_tlo = IDA_mem->ida_trout;
      }
      else {
        piVar2 = IDA_mem->ida_gactive;
        lVar14 = 0;
        do {
          if ((piVar2[lVar14] == 0) &&
             ((IDA_mem->ida_grout[lVar14] != 0.0 || (NAN(IDA_mem->ida_grout[lVar14]))))) {
            piVar2[lVar14] = 1;
            uVar9 = (ulong)(uint)IDA_mem->ida_nrtfn;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < (int)uVar9);
        IDA_mem->ida_tlo = IDA_mem->ida_trout;
        if (0 < (int)uVar9) {
          psVar17 = IDA_mem->ida_glo;
          psVar3 = IDA_mem->ida_grout;
          uVar16 = 0;
          do {
            psVar17[uVar16] = psVar3[uVar16];
            uVar16 = uVar16 + 1;
          } while ((uVar9 & 0xffffffff) != uVar16);
        }
      }
      if (bVar6) goto LAB_00115309;
    }
    else {
LAB_00114d63:
      dVar25 = IDA_mem->ida_tlo;
      dVar23 = IDA_mem->ida_thi;
      uVar21 = SUB84(dVar23,0);
      uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
      dVar23 = dVar23 - dVar25;
      dVar5 = ABS(dVar23);
      if (dVar5 <= dVar20) {
LAB_00115188:
        IDA_mem->ida_trout = (sunrealtype)CONCAT44(uVar22,uVar21);
LAB_00115190:
        piVar2 = IDA_mem->ida_iroots;
        psVar17 = IDA_mem->ida_ghi;
        psVar3 = IDA_mem->ida_grout;
        piVar4 = IDA_mem->ida_gactive;
        lVar14 = 0;
        do {
          dVar20 = psVar17[lVar14];
          psVar3[lVar14] = dVar20;
          piVar2[lVar14] = 0;
          if (piVar4[lVar14] != 0) {
            if ((dVar20 != 0.0) || (NAN(dVar20))) {
              sVar19 = IDA_mem->ida_glo[lVar14];
              uVar21 = SUB84(sVar19,0);
              uVar22 = (undefined4)((ulong)sVar19 >> 0x20);
            }
            else {
              dVar25 = IDA_mem->ida_glo[lVar14];
              uVar21 = SUB84(dVar25,0);
              uVar22 = (undefined4)((ulong)dVar25 >> 0x20);
              if ((double)IDA_mem->ida_rootdir[lVar14] * dVar25 <= 0.0) {
                piVar2[lVar14] = (uint)(dVar25 <= 0.0) * 2 + -1;
              }
            }
            if ((((0.0 < dVar20) &&
                 ((double)CONCAT44(uVar22,uVar21) <= 0.0 && (double)CONCAT44(uVar22,uVar21) != 0.0))
                || ((dVar20 < 0.0 &&
                    (0.0 <= (double)CONCAT44(uVar22,uVar21) &&
                     (double)CONCAT44(uVar22,uVar21) != 0.0)))) &&
               ((double)IDA_mem->ida_rootdir[lVar14] * (double)CONCAT44(uVar22,uVar21) <= 0.0)) {
              piVar2[lVar14] =
                   (uint)((double)CONCAT44(uVar22,uVar21) < 0.0 ||
                         (double)CONCAT44(uVar22,uVar21) == 0.0) * 2 + -1;
            }
          }
          lVar14 = lVar14 + 1;
          uVar9 = (ulong)IDA_mem->ida_nrtfn;
        } while (lVar14 < (long)uVar9);
LAB_00115276:
        bVar6 = false;
        goto LAB_00115278;
      }
      dVar26 = 1.0;
      dVar24 = 0.5;
      iVar8 = -1;
      iVar18 = 0;
      do {
        if (iVar8 == iVar18) {
          dVar26 = dVar26 * dVar24;
        }
        else {
          dVar26 = 1.0;
        }
        dVar24 = (double)CONCAT44(uVar22,uVar21) -
                 (dVar23 * IDA_mem->ida_ghi[iVar7]) /
                 (IDA_mem->ida_ghi[iVar7] - IDA_mem->ida_glo[iVar7] * dVar26);
        dVar5 = dVar5 / dVar20;
        if (ABS(dVar24 - dVar25) < dVar20 * 0.5) {
          dVar24 = (double)(-(ulong)(5.0 < dVar5) & 0x3fb999999999999a |
                           ~-(ulong)(5.0 < dVar5) & (ulong)(0.5 / dVar5)) * dVar23 + dVar25;
        }
        dVar25 = dVar24;
        if (ABS((double)CONCAT44(uVar22,uVar21) - dVar24) < dVar20 * 0.5) {
          dVar25 = (double)(-(ulong)(5.0 < dVar5) & 0xbfb999999999999a |
                           ~-(ulong)(5.0 < dVar5) & (ulong)(-0.5 / dVar5)) * dVar23 +
                   (double)CONCAT44(uVar22,uVar21);
        }
        IDAGetSolution(IDA_mem,dVar25,IDA_mem->ida_yy,IDA_mem->ida_yp);
        iVar8 = (*IDA_mem->ida_gfun)
                          (dVar25,IDA_mem->ida_yy,IDA_mem->ida_yp,IDA_mem->ida_grout,
                           IDA_mem->ida_user_data);
        IDA_mem->ida_nge = IDA_mem->ida_nge + 1;
        if (iVar8 != 0) {
          return -10;
        }
        uVar1 = IDA_mem->ida_nrtfn;
        lVar14 = (long)(int)uVar1;
        if (0 < lVar14) {
          bVar15 = true;
          bVar6 = false;
          lVar13 = 0;
          dVar20 = 0.0;
LAB_00114f3b:
          do {
            lVar10 = lVar13 + 1;
            if (IDA_mem->ida_gactive[lVar13] != 0) {
              psVar17 = IDA_mem->ida_grout;
              dVar23 = psVar17[lVar13];
              if ((dVar23 != 0.0) || (NAN(dVar23))) {
                dVar5 = IDA_mem->ida_glo[lVar13];
                if ((((0.0 < dVar23) && (dVar5 < 0.0)) || ((dVar23 < 0.0 && (0.0 < dVar5)))) &&
                   (((double)IDA_mem->ida_rootdir[lVar13] * dVar5 <= 0.0 &&
                    (dVar23 = ABS(dVar23 / (dVar23 - dVar5)), dVar20 < dVar23)))) {
                  iVar7 = (int)lVar13;
                  bVar15 = false;
                  lVar13 = lVar10;
                  dVar20 = dVar23;
                  if (lVar10 == lVar14) {
                    iVar7 = (int)lVar10 + -1;
                    goto LAB_001150bc;
                  }
                  goto LAB_00114f3b;
                }
              }
              else if ((double)IDA_mem->ida_rootdir[lVar13] * IDA_mem->ida_glo[lVar13] <= 0.0) {
                bVar6 = true;
              }
            }
            lVar13 = lVar10;
          } while (lVar10 != lVar14);
          if (bVar15) {
            if (!bVar6) {
              IDA_mem->ida_tlo = dVar25;
              psVar17 = IDA_mem->ida_glo;
              psVar3 = IDA_mem->ida_grout;
              lVar13 = 0;
              do {
                psVar17[lVar13] = psVar3[lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar14 != lVar13);
              dVar25 = IDA_mem->ida_tlo;
              goto LAB_0011507b;
            }
            IDA_mem->ida_thi = dVar25;
            psVar17 = IDA_mem->ida_ghi;
            psVar3 = IDA_mem->ida_grout;
            uVar9 = 0;
            do {
              psVar17[uVar9] = psVar3[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar1 != uVar9);
            uVar21 = SUB84(IDA_mem->ida_thi,0);
            uVar22 = (undefined4)((ulong)IDA_mem->ida_thi >> 0x20);
            goto LAB_00115188;
          }
          psVar17 = IDA_mem->ida_grout;
LAB_001150bc:
          IDA_mem->ida_thi = dVar25;
          psVar3 = IDA_mem->ida_ghi;
          lVar13 = 0;
          do {
            psVar3[lVar13] = psVar17[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar14 != lVar13);
          dVar25 = IDA_mem->ida_tlo;
          dVar23 = IDA_mem->ida_thi;
          uVar21 = SUB84(dVar23,0);
          uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
          dVar23 = dVar23 - dVar25;
          dVar5 = ABS(dVar23);
          dVar20 = IDA_mem->ida_ttol;
          if (dVar20 < dVar5) {
            iVar11 = 1;
            dVar24 = 0.5;
            goto LAB_0011511c;
          }
          break;
        }
        IDA_mem->ida_tlo = dVar25;
LAB_0011507b:
        dVar23 = IDA_mem->ida_thi;
        uVar21 = SUB84(dVar23,0);
        uVar22 = (undefined4)((ulong)dVar23 >> 0x20);
        dVar20 = IDA_mem->ida_ttol;
        dVar23 = dVar23 - dVar25;
        dVar5 = ABS(dVar23);
        if (dVar5 <= dVar20) break;
        iVar11 = 2;
        dVar24 = 2.0;
LAB_0011511c:
        iVar8 = iVar18;
        iVar18 = iVar11;
      } while (dVar20 < dVar5);
      IDA_mem->ida_trout = (sunrealtype)CONCAT44(uVar22,uVar21);
      if (0 < (int)uVar1) goto LAB_00115190;
      IDA_mem->ida_tlo = IDA_mem->ida_trout;
    }
    IDAGetSolution(IDA_mem,IDA_mem->ida_trout,IDA_mem->ida_yy,IDA_mem->ida_yp);
    iVar7 = 1;
  }
  return iVar7;
}

Assistant:

static int IDARcheck3(IDAMem IDA_mem)
{
  int i, ier, retval;

  /* Set thi = tn or tout, whichever comes first. */
  if (IDA_mem->ida_taskc == IDA_ONE_STEP)
  {
    IDA_mem->ida_thi = IDA_mem->ida_tn;
  }
  if (IDA_mem->ida_taskc == IDA_NORMAL)
  {
    IDA_mem->ida_thi =
      ((IDA_mem->ida_toutc - IDA_mem->ida_tn) * IDA_mem->ida_hh >= ZERO)
        ? IDA_mem->ida_tn
        : IDA_mem->ida_toutc;
  }

  /* Get y and y' at thi. */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_thi, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);

  /* Set ghi = g(thi) and call IDARootfind to search (tlo,thi) for roots. */
  retval = IDA_mem->ida_gfun(IDA_mem->ida_thi, IDA_mem->ida_yy, IDA_mem->ida_yp,
                             IDA_mem->ida_ghi, IDA_mem->ida_user_data);
  IDA_mem->ida_nge++;
  if (retval != 0) { return (IDA_RTFUNC_FAIL); }

  IDA_mem->ida_ttol = ((SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh)) *
                       IDA_mem->ida_uround * HUNDRED);
  ier               = IDARootfind(IDA_mem);
  if (ier == IDA_RTFUNC_FAIL) { return (IDA_RTFUNC_FAIL); }
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    if (!IDA_mem->ida_gactive[i] && IDA_mem->ida_grout[i] != ZERO)
    {
      IDA_mem->ida_gactive[i] = SUNTRUE;
    }
  }
  IDA_mem->ida_tlo = IDA_mem->ida_trout;
  for (i = 0; i < IDA_mem->ida_nrtfn; i++)
  {
    IDA_mem->ida_glo[i] = IDA_mem->ida_grout[i];
  }

  /* If no root found, return IDA_SUCCESS. */
  if (ier == IDA_SUCCESS) { return (IDA_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)IDAGetSolution(IDA_mem, IDA_mem->ida_trout, IDA_mem->ida_yy,
                       IDA_mem->ida_yp);
  return (RTFOUND);
}